

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O1

ExpressionValue *
expFuncRead<int>(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
                vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  bool bVar1;
  char cVar2;
  long lVar3;
  int64_t pos;
  int buffer;
  StringLiteral *fileName;
  path fullName;
  ifstream file;
  int64_t local_260;
  int local_254;
  StringLiteral *local_250;
  unsigned_long local_248;
  path local_240;
  undefined1 local_220 [32];
  byte abStack_200 [224];
  undefined8 local_120 [33];
  
  bVar1 = getExpFuncParameter(parameters,0,&local_250,funcName,false);
  if (!bVar1) {
LAB_0013034b:
    (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
    (__return_storage_ptr__->strValue)._value._M_string_length = 0;
    (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->type = Invalid;
    (__return_storage_ptr__->field_1).intValue = 0;
    return __return_storage_ptr__;
  }
  local_260 = 0;
  bVar1 = getExpFuncParameter(parameters,1,&local_260,funcName,true);
  if (!bVar1) goto LAB_0013034b;
  StringLiteral::path((path *)local_220,local_250);
  getFullPathName(&local_240,(path *)local_220);
  ghc::filesystem::path::~path((path *)local_220);
  ghc::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
            ((basic_ifstream<char,_std::char_traits<char>_> *)local_220,&local_240,_S_in|_S_bin);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    Logger::queueError<StringLiteral>
              ((Logger *)0x1,0x1895cd,(char *)local_250,(StringLiteral *)funcName);
  }
  else {
    std::istream::seekg(local_220,local_260,0);
    if ((abStack_200[*(long *)(local_220._0_8_ + -0x18)] & 7) == 0) {
      std::istream::read(local_220,(long)&local_254);
      bVar1 = (abStack_200[*(long *)(local_220._0_8_ + -0x18)] & 5) == 0;
      if (bVar1) {
        lVar3 = (long)local_254;
      }
      else {
        local_248 = 4;
        Logger::queueError<unsigned_long,long,StringLiteral>
                  (Error,"Failed to read %d byte(s) from offset 0x%08X of %s",&local_248,&local_260,
                   local_250);
        lVar3 = 0;
      }
      (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
      (__return_storage_ptr__->strValue)._value._M_string_length = 0;
      (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
      __return_storage_ptr__->type = (uint)bVar1;
      (__return_storage_ptr__->field_1).intValue = lVar3;
      goto LAB_0013039c;
    }
    Logger::queueError<long,StringLiteral>(Error,"Invalid offset 0x%08X of %s",&local_260,local_250)
    ;
  }
  (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
  (__return_storage_ptr__->strValue)._value._M_string_length = 0;
  (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->type = Invalid;
  (__return_storage_ptr__->field_1).intValue = 0;
LAB_0013039c:
  local_220._0_8_ =
       std::ifstream-in-ghc::filesystem::basic_ifstream<char,std::char_traits<char>>::
       construction_vtable + 0x18;
  local_120[0] = 0x1be630;
  std::filebuf::~filebuf((filebuf *)(local_220 + 0x10));
  local_220._0_8_ =
       std::istream-in-ghc::filesystem::basic_ifstream<char,std::char_traits<char>>::
       construction_vtable + 0x18;
  local_120[0] = 0x1be680;
  local_220._8_8_ = 0;
  std::ios_base::~ios_base((ios_base *)local_120);
  ghc::filesystem::path::~path(&local_240);
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncRead(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	const StringLiteral* fileName;
	int64_t pos;

	GET_PARAM(parameters,0,fileName);
	GET_OPTIONAL_PARAM(parameters,1,pos,0);

	auto fullName = getFullPathName(fileName->path());

	fs::ifstream file(fullName, fs::ifstream::in | fs::ifstream::binary);
	if (!file.is_open())
	{
		Logger::queueError(Logger::Error, "Could not open %s",*fileName);
		return ExpressionValue();
	}

	file.seekg(pos);
	if (file.eof() || file.fail())
	{
		Logger::queueError(Logger::Error, "Invalid offset 0x%08X of %s", pos, *fileName);
		return ExpressionValue();
	}

	T buffer;
	file.read(reinterpret_cast<char*>(&buffer), sizeof(T));

	if (file.fail())
	{
		Logger::queueError(Logger::Error, "Failed to read %d byte(s) from offset 0x%08X of %s", sizeof(T), pos, *fileName);
		return ExpressionValue();
	}

	return ExpressionValue((int64_t) buffer);
}